

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embed.cpp
# Opt level: O2

int __thiscall ncnn::Embed::forward(Embed *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  void *pvVar2;
  size_t sVar3;
  void *pvVar4;
  int iVar5;
  ulong uVar6;
  uint _h;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  int local_48;
  
  _h = bottom_blob->c * (int)bottom_blob->cstep;
  Mat::create(top_blob,this->num_output,_h,4,opt->blob_allocator);
  local_48 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    local_48 = 0;
    if ((int)_h < 1) {
      _h = 0;
    }
    for (uVar8 = 0; uVar8 != _h; uVar8 = uVar8 + 1) {
      pvVar2 = top_blob->data;
      sVar3 = top_blob->elemsize;
      iVar1 = top_blob->w;
      iVar5 = *(int *)((long)bottom_blob->data + uVar8 * 4);
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      iVar9 = this->input_dim + -1;
      if (iVar5 < this->input_dim) {
        iVar9 = iVar5;
      }
      memcpy((void *)((long)((int)uVar8 * iVar1) * sVar3 + (long)pvVar2),
             (void *)((long)iVar9 * (long)this->num_output * 4 + (long)(this->weight_data).data),
             (long)this->num_output << 2);
      if (this->bias_term != 0) {
        pvVar4 = (this->bias_data).data;
        uVar6 = (ulong)(uint)this->num_output;
        if (this->num_output < 1) {
          uVar6 = 0;
        }
        lVar10 = sVar3 * (long)(iVar1 * (int)uVar8);
        for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
          *(float *)((long)pvVar2 + uVar7 * 4 + lVar10) =
               *(float *)((long)pvVar2 + uVar7 * 4 + lVar10) + *(float *)((long)pvVar4 + uVar7 * 4);
        }
      }
    }
  }
  return local_48;
}

Assistant:

int Embed::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int words = bottom_blob.total();

    top_blob.create(num_output, words, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<words; q++)
    {
        float* outptr = top_blob.row(q);

        int word_index = ((const int*)bottom_blob)[q];

        if (word_index < 0)
            word_index = 0;
        if (word_index >= input_dim)
            word_index = input_dim - 1;

        const float* em = (const float*)weight_data + num_output * word_index;

        memcpy(outptr, em, num_output * sizeof(float));

        if (bias_term)
        {
            for (int p=0; p<num_output; p++)
            {
                outptr[p] += bias_data[p];
            }
        }
    }

    return 0;
}